

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

string * __thiscall
llama_vocab::impl::type_name_abi_cxx11_(string *__return_storage_ptr__,impl *this)

{
  llama_vocab_type lVar1;
  char *pcVar2;
  char *pcVar3;
  
  lVar1 = this->type;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(lVar1) {
  case LLAMA_VOCAB_TYPE_NONE:
    pcVar3 = "no vocab";
    pcVar2 = "";
    break;
  case LLAMA_VOCAB_TYPE_SPM:
    pcVar3 = "SPM";
    pcVar2 = "";
    break;
  case LLAMA_VOCAB_TYPE_BPE:
    pcVar3 = "BPE";
    pcVar2 = "";
    break;
  case LLAMA_VOCAB_TYPE_WPM:
    pcVar3 = "WPM";
    pcVar2 = "";
    break;
  case LLAMA_VOCAB_TYPE_UGM:
    pcVar3 = "UGM";
    pcVar2 = "";
    break;
  case LLAMA_VOCAB_TYPE_RWKV:
    pcVar3 = "RWKV";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "unknown";
    pcVar2 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string llama_vocab::impl::type_name() const{
    switch (type) {
        case LLAMA_VOCAB_TYPE_NONE: return "no vocab";
        case LLAMA_VOCAB_TYPE_SPM:  return "SPM";
        case LLAMA_VOCAB_TYPE_BPE:  return "BPE";
        case LLAMA_VOCAB_TYPE_WPM:  return "WPM";
        case LLAMA_VOCAB_TYPE_UGM:  return "UGM";
        case LLAMA_VOCAB_TYPE_RWKV: return "RWKV";
        default:                    return "unknown";
    }
}